

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O2

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CType *stm)

{
  string *this_00;
  undefined1 auStack_48 [48];
  
  this_00 = (string *)auStack_48;
  std::operator<<((ostream *)&std::cout,"typechecker: type\n");
  if ((stm->name)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
      super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
      super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl == (CIdExp *)0x0) {
    CError::CError((CError *)auStack_48,&CError::AST_ERROR_abi_cxx11_,
                   &(stm->super_IWrapper).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)auStack_48);
  }
  else {
    TypeInfo::TypeInfo((TypeInfo *)auStack_48,VOID);
    TypeInfo::operator=(&this->lastCalculatedType,(TypeInfo *)auStack_48);
    this_00 = (string *)(auStack_48 + 8);
  }
  std::__cxx11::string::~string(this_00);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CType &stm ) 
{
	std::cout << "typechecker: type\n";
    if( stm.name ) {
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}